

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

void dg::llvmdg::dropAllUses<llvm::Instruction>(Instruction *V)

{
  bool bVar1;
  Use *this;
  ret_type pIVar2;
  Value *in_RDI;
  Value *use;
  use_iterator E;
  use_iterator I;
  Value *in_stack_ffffffffffffffd8;
  User *in_stack_ffffffffffffffe0;
  
  llvm::Value::use_begin(in_stack_ffffffffffffffd8);
  llvm::Value::use_end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = llvm::Value::use_iterator_impl<llvm::Use>::operator!=
                      ((use_iterator_impl<llvm::Use> *)in_stack_ffffffffffffffe0,
                       (use_iterator_impl<llvm::Use> *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    this = llvm::Value::use_iterator_impl<llvm::Use>::operator->
                     ((use_iterator_impl<llvm::Use> *)0x197176);
    in_stack_ffffffffffffffe0 = llvm::Use::getUser(this);
    pIVar2 = llvm::cast<llvm::Instruction,llvm::Value>((Value *)0x19718d);
    llvm::User::replaceUsesOfWith((Value *)pIVar2,in_RDI);
    llvm::Value::use_iterator_impl<llvm::Use>::operator++
              ((use_iterator_impl<llvm::Use> *)in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

static void dropAllUses(Val *V) {
    for (auto I = V->use_begin(), E = V->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        llvm::Value *use = *I;
#else
        llvm::Value *use = I->getUser();
#endif

        // drop the reference to this value
        llvm::cast<llvm::Instruction>(use)->replaceUsesOfWith(V, nullptr);
    }
}